

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall
despot::util::tinyxml::TiXmlElement::SetAttribute(TiXmlElement *this,char *name,int val)

{
  char buf [64];
  char acStack_58 [64];
  
  snprintf(acStack_58,0x40,"%d",val);
  SetAttribute(this,name,acStack_58);
  return;
}

Assistant:

void TiXmlElement::SetAttribute(const char * name, int val) {
	char buf[64];
#if defined(TIXML_SNPRINTF)
	TIXML_SNPRINTF(buf, sizeof(buf), "%d", val);
#else
	sprintf( buf, "%d", val );
#endif
	SetAttribute(name, buf);
}